

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

BiasLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_bias(NeuralNetworkLayer *this)

{
  BiasLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0xfa) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xfa;
    this_00 = (BiasLayerParams *)operator_new(0x38);
    BiasLayerParams::BiasLayerParams(this_00);
    (this->layer_).bias_ = this_00;
  }
  return (BiasLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BiasLayerParams* NeuralNetworkLayer::mutable_bias() {
  if (!has_bias()) {
    clear_layer();
    set_has_bias();
    layer_.bias_ = new ::CoreML::Specification::BiasLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.bias)
  return layer_.bias_;
}